

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFileFeatures
          (DescriptorBuilder *this,FileDescriptor *file,FileDescriptorProto *proto)

{
  string_view element_name;
  string_view element_name_00;
  
  if (999 < (int)file->edition_) {
    if ((file->merged_features_->field_0)._impl_.field_presence_ == 3) {
      element_name._M_str = (file->name_->_M_dataplus)._M_p;
      element_name._M_len = file->name_->_M_string_length;
      AddError(this,element_name,&proto->super_Message,EDITIONS,
               "Required presence can\'t be specified by default.");
    }
    if ((file->options_->field_0)._impl_.java_string_check_utf8_ == true) {
      element_name_00._M_str = (file->name_->_M_dataplus)._M_p;
      element_name_00._M_len = file->name_->_M_string_length;
      AddError(this,element_name_00,&proto->super_Message,EDITIONS,
               "File option java_string_check_utf8 is not allowed under editions. Use the (pb.java).utf8_validation feature to control this behavior."
              );
      return;
    }
  }
  return;
}

Assistant:

bool IsLegacyEdition(Edition edition) {
  return edition < Edition::EDITION_2023;
}